

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * rbuMainToWal(char *zName,int flags)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  
  sVar4 = strlen(zName);
  if ((flags & 0x40U) == 0) {
    pcVar6 = zName + (long)(int)sVar4 + -1;
    do {
      pcVar5 = pcVar6 + 1;
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar5;
    } while (*pcVar1 == '\0');
LAB_001d3b63:
    return pcVar5 + ((long)((sVar4 << 0x20) + 0x900000000) >> 0x20);
  }
  pcVar5 = zName + (long)(int)sVar4 + 2;
  bVar2 = false;
  do {
    if (pcVar5[-2] == '\0') {
      bVar3 = !bVar2;
      bVar2 = false;
      if (bVar3) {
        bVar2 = true;
        if (pcVar5[-1] == '\0') goto LAB_001d3b63;
      }
    }
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

static const char *rbuMainToWal(const char *zName, int flags){
  int n = (int)strlen(zName);
  const char *z = &zName[n];
  if( flags & SQLITE_OPEN_URI ){
    int odd = 0;
    while( 1 ){
      if( z[0]==0 ){
        odd = 1 - odd;
        if( odd && z[1]==0 ) break;
      }
      z++;
    }
    z += 2;
  }else{
    while( *z==0 ) z++;
  }
  z += (n + 8 + 1);
  return z;
}